

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O2

void __thiscall Nes_Square::run(Nes_Square *this,cpu_time_t time,cpu_time_t end_time)

{
  uint uVar1;
  byte bVar2;
  Blip_Buffer *pBVar3;
  Blip_Synth<3,_15> *this_00;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong time_00;
  
  pBVar3 = (this->super_Nes_Envelope).super_Nes_Osc.output;
  if (pBVar3 == (Blip_Buffer *)0x0) {
    return;
  }
  uVar4 = Nes_Envelope::volume(&this->super_Nes_Envelope);
  uVar5 = (uint)(this->super_Nes_Envelope).super_Nes_Osc.regs[2] |
          ((this->super_Nes_Envelope).super_Nes_Osc.regs[3] & 7) << 8;
  uVar1 = uVar5 * 2 + 2;
  uVar8 = (ulong)uVar1;
  if ((uVar4 != 0) && (7 < uVar5)) {
    bVar2 = (this->super_Nes_Envelope).super_Nes_Osc.regs[1];
    uVar7 = uVar5 >> (bVar2 & 7);
    if ((bVar2 & 8) != 0) {
      uVar7 = 0;
    }
    if (uVar7 + uVar5 < 0x800) {
      bVar2 = (this->super_Nes_Envelope).super_Nes_Osc.regs[0] >> 6;
      uVar5 = 0;
      if (bVar2 == 3) {
        uVar5 = uVar4;
      }
      uVar7 = 2;
      if (bVar2 != 3) {
        uVar7 = 1 << bVar2;
      }
      iVar6 = (this->super_Nes_Envelope).super_Nes_Osc.last_amp;
      uVar9 = 0;
      if (this->phase < (int)uVar7) {
        uVar9 = uVar4;
      }
      uVar9 = uVar9 ^ uVar5;
      (this->super_Nes_Envelope).super_Nes_Osc.last_amp = uVar9;
      iVar6 = uVar9 - iVar6;
      if (iVar6 != 0) {
        Blip_Synth<3,_15>::offset(this->synth,time,iVar6,pBVar3);
      }
      time_00 = (this->super_Nes_Envelope).super_Nes_Osc.delay + time;
      if ((long)time_00 < end_time) {
        pBVar3 = (this->super_Nes_Envelope).super_Nes_Osc.output;
        this_00 = this->synth;
        iVar6 = uVar9 * 2 - uVar4;
        uVar5 = this->phase;
        do {
          uVar5 = uVar5 + 1 & 7;
          if ((uVar5 & ~uVar7) == 0) {
            iVar6 = -iVar6;
            Blip_Synth<3,_15>::offset_inline(this_00,time_00,iVar6,pBVar3);
          }
          time_00 = time_00 + uVar1;
        } while ((long)time_00 < end_time);
        (this->super_Nes_Envelope).super_Nes_Osc.last_amp = (int)(iVar6 + uVar4) >> 1;
        this->phase = uVar5;
      }
      goto LAB_00112c2d;
    }
  }
  iVar6 = (this->super_Nes_Envelope).super_Nes_Osc.last_amp;
  if (iVar6 != 0) {
    Blip_Synth<3,_15>::offset(this->synth,time,-iVar6,pBVar3);
    (this->super_Nes_Envelope).super_Nes_Osc.last_amp = 0;
  }
  time_00 = (this->super_Nes_Envelope).super_Nes_Osc.delay + time;
  if ((long)time_00 < end_time) {
    iVar6 = (int)((long)(~time_00 + end_time + uVar8) / (long)uVar8);
    this->phase = iVar6 + this->phase & 7;
    time_00 = time_00 + (long)iVar6 * uVar8;
  }
LAB_00112c2d:
  (this->super_Nes_Envelope).super_Nes_Osc.delay = (int)time_00 - (int)end_time;
  return;
}

Assistant:

void Nes_Square::run( cpu_time_t time, cpu_time_t end_time )
{
	if ( !output )
		return;
	
	const int volume = this->volume();
	const int period = this->period();
	int offset = period >> (regs [1] & shift_mask);
	if ( regs [1] & negate_flag )
		offset = 0;
	
	const int timer_period = (period + 1) * 2;
	if ( volume == 0 || period < 8 || (period + offset) >= 0x800 )
	{
		if ( last_amp ) {
			synth->offset( time, -last_amp, output );
			last_amp = 0;
		}
		
		time += delay;
		if ( time < end_time )
		{
			// maintain proper phase
			int count = (end_time - time + timer_period - 1) / timer_period;
			phase = (phase + count) & (phase_range - 1);
			time += (long) count * timer_period;
		}
	}
	else
	{
		// handle duty select
		int duty_select = (regs [0] >> 6) & 3;
		int duty = 1 << duty_select; // 1, 2, 4, 2
		int amp = 0;
		if ( duty_select == 3 ) {
			duty = 2; // negated 25%
			amp = volume;
		}
		if ( phase < duty )
			amp ^= volume;
		
		int delta = update_amp( amp );
		if ( delta )
			synth->offset( time, delta, output );
		
		time += delay;
		if ( time < end_time )
		{
			Blip_Buffer* const output = this->output;
			const Synth* synth = this->synth;
			int delta = amp * 2 - volume;
			int phase = this->phase;
			
			do {
				phase = (phase + 1) & (phase_range - 1);
				if ( phase == 0 || phase == duty ) {
					delta = -delta;
					synth->offset_inline( time, delta, output );
				}
				time += timer_period;
			}
			while ( time < end_time );
			
			last_amp = (delta + volume) >> 1;
			this->phase = phase;
		}
	}
	
	delay = time - end_time;
}